

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imu-attitude-trajectory-reconstruction.hxx
# Opt level: O0

examples * __thiscall
stateObservation::examples::imuAttitudeTrajectoryReconstruction
          (examples *this,IndexedMatrixArray *y,Vector *xh0,Matrix *p,Matrix *q,Matrix *r,double dt)

{
  uint uVar1;
  uint uVar2;
  ConstantReturnType local_e8;
  Matrix local_d0;
  uint local_a4;
  IndexedMatrixArray local_a0 [4];
  uint k;
  IndexedMatrixArray u;
  uint inputSize;
  double dt_local;
  Matrix *r_local;
  Matrix *q_local;
  Matrix *p_local;
  Vector *xh0_local;
  IndexedMatrixArray *y_local;
  
  stateObservation::IndexedMatrixArray::IndexedMatrixArray(local_a0);
  local_a4 = IndexedMatrixArray::getFirstIndex(y);
  local_a4 = local_a4 - 1;
  while( true ) {
    uVar1 = local_a4;
    uVar2 = IndexedMatrixArray::getLastIndex(y);
    if (uVar2 <= uVar1) break;
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Zero(&local_e8,6,1);
    Eigen::Matrix<double,-1,-1,0,-1,-1>::
    Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
              ((Matrix<double,_1,_1,0,_1,_1> *)&local_d0,
               (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                *)&local_e8);
    IndexedMatrixArray::setValue(local_a0,&local_d0,local_a4);
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_d0);
    local_a4 = local_a4 + 1;
  }
  imuAttitudeTrajectoryReconstruction(this,y,local_a0,xh0,p,q,r,dt);
  IndexedMatrixArray::~IndexedMatrixArray(local_a0);
  return this;
}

Assistant:

IndexedMatrixArray imuAttitudeTrajectoryReconstruction(
    const IndexedMatrixArray & y,
    const Vector & xh0,
    const Matrix & p,
    const Matrix & q,
    const Matrix & r,
    double dt)
{
    const unsigned inputSize=6;

    ///initialization of a zero input
    IndexedMatrixArray u;
    for (unsigned k=y.getFirstIndex()-1; k<y.getLastIndex(); ++k)
    {
        u.setValue(Vector::Zero(inputSize,1),k);
    }

    return imuAttitudeTrajectoryReconstruction (y, u, xh0, p, q, r, dt);
}